

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

void __thiscall
edition_unittest::TestChildExtensionData::~TestChildExtensionData(TestChildExtensionData *this)

{
  InternalMetadata *this_00;
  TestChildExtensionData_NestedTestAllExtensionsData *this_01;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.a_);
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.b_);
    this_01 = (this->field_0)._impl_.optional_extension_;
    if (this_01 != (TestChildExtensionData_NestedTestAllExtensionsData *)0x0) {
      TestChildExtensionData_NestedTestAllExtensionsData::
      ~TestChildExtensionData_NestedTestAllExtensionsData(this_01);
    }
    operator_delete(this_01,0x20);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/edition_unittest.pb.cc"
             ,0x3b5b,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestChildExtensionData::~TestChildExtensionData() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestChildExtensionData)
  SharedDtor(*this);
}